

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

sock_t next_client(serv_sock_t *server,int listenlen)

{
  sock_t sVar1;
  socklen_t clientlen;
  sockaddr_in client_addr;
  socklen_t local_1c;
  sockaddr local_18;
  
  listen(server->sockfd,listenlen);
  local_1c = 0x10;
  sVar1.sockfd = accept(server->sockfd,&local_18,&local_1c);
  sVar1.is_valid._0_1_ = -1 < sVar1.sockfd;
  sVar1.is_valid._1_3_ = 0;
  return sVar1;
}

Assistant:

static sock_t
next_client(serv_sock_t* server, const int listenlen)
{
  /* the socket to be returned */
  sock_t ret = {
#ifdef unix
    .sockfd = 0,
#elif defined(_WIN32)
    .sock = INVALID_SOCKET,
#endif /* unix */
    .is_valid = false
  };

#ifdef unix
  struct sockaddr_in client_addr;
  socklen_t clientlen;

  listen(server->sockfd, listenlen);
  clientlen = sizeof(client_addr);
  ret.sockfd =
    accept(server->sockfd, (struct sockaddr*)&client_addr, &clientlen);
  if (ret.sockfd < 0)
    goto FAILURE;
#elif defined(_WIN32)
  int winapi_result = 0;

  winapi_result = listen(server->sock, listenlen);

  if (winapi_result == SOCKET_ERROR) {
    goto FAILURE;
  }

  ret.sock = accept(server->sock, NULL, NULL);

  if (ret.sock == INVALID_SOCKET) {
    goto FAILURE;
  }
#endif /* unix */

  ret.is_valid = true;
  return ret;

FAILURE:
  ret.is_valid = false;
  return ret;
}